

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall
wasm::TranslateToFuzzReader::makeBlock(TranslateToFuzzReader *this,Type type)

{
  Random *this_00;
  pointer *pppEVar1;
  int iVar2;
  uintptr_t uVar3;
  Type type_00;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  Block *left;
  Expression *pEVar7;
  ulong uVar8;
  MixedArena *this_01;
  string_view sVar9;
  optional<wasm::Type> type_01;
  Block *local_40;
  Type local_38;
  
  this_01 = &((this->builder).wasm)->allocator;
  left = (Block *)MixedArena::allocSpace(this_01,0x40,8);
  (left->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = BlockId;
  (left->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
  (left->name).super_IString.str._M_len = 0;
  (left->name).super_IString.str._M_str = (char *)0x0;
  (left->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data =
       (Expression **)0x0;
  (left->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  usedElements = 0;
  (left->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  allocatedElements = 0;
  (left->list).allocator = this_01;
  (left->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = type.id;
  local_38.id = type.id;
  sVar9 = (string_view)makeLabel(this);
  (left->name).super_IString.str = sVar9;
  local_40 = left;
  std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::emplace_back<wasm::Expression*>
            ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
             &this->funcContext->breakableStack,(Expression **)&local_40);
  this_00 = &this->random;
  uVar4 = Random::upTo(this_00,(this->fuzzParams->super_FuzzParams).BLOCK_FACTOR - 1);
  uVar5 = Random::upTo(this_00,uVar4);
  iVar2 = (this->fuzzParams->super_FuzzParams).NESTING_LIMIT;
  uVar4 = uVar5;
  if ((iVar2 / 2 <= this->nesting) && (uVar4 = uVar5 >> 1, iVar2 <= this->nesting)) {
    uVar6 = Random::upTo(this_00,2);
    if (uVar6 == 0) {
      uVar4 = uVar5 >> 2;
    }
  }
  if (uVar4 == 0) {
    uVar4 = Random::upTo(this_00,10);
    uVar4 = (uint32_t)(uVar4 != 0);
  }
  if (uVar4 != 0) {
    do {
      if ((this->random).finishedInput != false) break;
      pEVar7 = make(this,(Type)0x0);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&(left->list).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,pEVar7)
      ;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  type_00.id = local_38.id;
  if ((local_38.id < 2 || (this->random).finishedInput != false) ||
     (uVar4 = Random::upTo(this_00,2), uVar4 != 0)) {
    pEVar7 = make(this,type_00);
  }
  else {
    pEVar7 = makeBreak(this,(Type)0x1);
  }
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            (&(left->list).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,pEVar7);
  pppEVar1 = &(this->funcContext->breakableStack).
              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  *pppEVar1 = *pppEVar1 + -1;
  uVar8 = 0;
  wasm::Block::finalize(left);
  uVar3 = (left->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id;
  if (uVar3 != type_00.id) {
    if ((type_00.id != 1) || (uVar3 != 0)) {
      __assert_fail("type == Type::unreachable && ret->type == Type::none",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0x91b,"Expression *wasm::TranslateToFuzzReader::makeBlock(Type)");
    }
    pEVar7 = make(this,(Type)0x1);
    type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar8;
    left = Builder::makeSequence(&this->builder,(Expression *)left,pEVar7,type_01);
  }
  return (Expression *)left;
}

Assistant:

Expression* TranslateToFuzzReader::makeBlock(Type type) {
  auto* ret = builder.makeBlock();
  ret->type = type; // so we have it during child creation
  ret->name = makeLabel();
  funcContext->breakableStack.push_back(ret);
  Index num = upToSquared(fuzzParams->BLOCK_FACTOR - 1); // we add another later
  if (nesting >= fuzzParams->NESTING_LIMIT / 2) {
    // smaller blocks past the limit
    num /= 2;
    if (nesting >= fuzzParams->NESTING_LIMIT && oneIn(2)) {
      // smaller blocks past the limit
      num /= 2;
    }
  }
  // not likely to have a block of size 1
  if (num == 0 && !oneIn(10)) {
    num++;
  }
  while (num > 0 && !random.finished()) {
    ret->list.push_back(make(Type::none));
    num--;
  }
  // give a chance to make the final element an unreachable break, instead
  // of concrete - a common pattern (branch to the top of a loop etc.)
  if (!random.finished() && type.isConcrete() && oneIn(2)) {
    ret->list.push_back(makeBreak(Type::unreachable));
  } else {
    ret->list.push_back(make(type));
  }
  funcContext->breakableStack.pop_back();
  if (type.isConcrete()) {
    ret->finalize(type);
  } else {
    ret->finalize();
  }
  if (ret->type != type) {
    // e.g. we might want an unreachable block, but a child breaks to it
    assert(type == Type::unreachable && ret->type == Type::none);
    return builder.makeSequence(ret, make(Type::unreachable));
  }
  return ret;
}